

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O3

void __thiscall
onmt::Tokenizer::tokenize_text
          (Tokenizer *this,string *text,
          vector<onmt::Token,_std::allocator<onmt::Token>_> *annotated_tokens,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *alphabets)

{
  ulong begin;
  CharType CVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  Mode MVar7;
  Mode MVar8;
  Casing CVar9;
  mapped_type *pmVar10;
  const_iterator cVar11;
  ulong end;
  ulong uVar12;
  char *__s;
  CharType *pCVar13;
  CharInfo *c;
  pointer pCVar14;
  CharInfo *character;
  pointer pCVar15;
  ulong uVar16;
  int iVar17;
  pointer pCVar18;
  int alphabet;
  vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> chars;
  vector<int,_std::allocator<int>_> scripts;
  TokensBuilder builder;
  key_type local_128;
  int local_124;
  CharType local_120;
  allocator<char> local_119;
  vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> local_118;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_100;
  vector<int,_std::allocator<int>_> local_f8;
  TokensBuilder local_e0;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_60;
  string *local_58;
  key_type local_50;
  
  local_100 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)alphabets;
  unicode::get_characters_info(&local_118,text);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&local_f8,
             (long)local_118.
                   super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_118.
                   super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  pCVar18 = local_118.
            super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pCVar15 = local_118.
            super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_118.
      super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_118.
      super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar17 = -1;
    pCVar14 = local_118.
              super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      iVar6 = unicode::get_script(pCVar14->value,iVar17);
      local_e0._tokens =
           (vector<onmt::Token,_std::allocator<onmt::Token>_> *)
           CONCAT44(local_e0._tokens._4_4_,iVar6);
      if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_e0);
      }
      else {
        *local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar6;
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if ((int)local_e0._tokens != -1) {
        iVar17 = (int)local_e0._tokens;
      }
      pCVar14 = pCVar14 + 1;
      pCVar15 = local_118.
                super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (pCVar14 != pCVar18);
  }
  local_e0._current_token.surface._M_dataplus._M_p =
       (pointer)&local_e0._current_token.surface.field_2;
  local_e0._no_substitution = (this->_options).no_substitution;
  local_e0._current_token.surface._M_string_length = 0;
  local_e0._current_token.surface.field_2._M_local_buf[0] = '\0';
  local_e0._current_token.type = Word;
  local_e0._current_token.casing = None;
  local_e0._current_token.join_left = false;
  local_e0._current_token.join_right = false;
  local_e0._current_token.spacer = false;
  local_e0._current_token.preserve = false;
  local_e0._current_feature._M_dataplus._M_p = (pointer)&local_e0._current_feature.field_2;
  local_e0._current_token.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0._current_token.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0._current_token.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._current_length = 0;
  local_e0._current_feature._M_string_length = 0;
  local_e0._current_feature.field_2._M_local_buf[0] = '\0';
  local_e0._tokens = annotated_tokens;
  if ((long)pCVar15 -
      (long)local_118.
            super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    uVar16 = (long)pCVar15 -
             (long)local_118.
                   super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    local_58 = &(this->_options).joiner;
    local_60 = &(this->_options).segment_alphabet_codes._M_h;
    local_124 = -1;
    iVar17 = 2;
    uVar12 = 0;
    do {
      iVar6 = local_118.
              super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar12].value;
      if (iVar6 != 0xfeff && 0x1f < iVar6) {
        begin = uVar12 + 1;
        end = begin;
        if (begin < uVar16) {
          pCVar13 = &local_118.
                     super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar12 + 1].char_type;
          do {
            if ((*pCVar13 != Mark) ||
               ((((this->_options).allow_isolated_marks & 1U) != 0 &&
                ((local_118.
                  super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar12].char_type == Separator ||
                 ((((this->_options).segment_alphabet_change & 1U) != 0 &&
                  (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[end] !=
                   local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12])))))))) goto LAB_001b46b0;
            end = end + 1;
            pCVar13 = pCVar13 + 8;
          } while (uVar16 != end);
          pCVar18 = (pointer)0x0;
          end = uVar16;
        }
        else {
LAB_001b46b0:
          pCVar18 = local_118.
                    super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start + end;
          if (uVar16 <= end) {
            pCVar18 = (pointer)0x0;
          }
        }
        character = local_118.
                    super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar12;
        if (iVar17 == 4) {
          if (iVar6 == 0xff60) {
            std::__cxx11::string::append((char *)&local_e0._current_token,(ulong)character->data);
            local_e0._current_length = local_e0._current_length + 1;
            iVar17 = 0;
            local_124 = -2;
            if ((this->_options).preserve_placeholders == true) {
              local_e0._current_token.preserve = true;
            }
          }
          else {
            if (character->char_type != Separator) {
              std::__cxx11::string::append((char *)&local_e0._current_token,(ulong)character->data);
              goto LAB_001b4928;
            }
            iVar17 = 4;
            TokensBuilder::escape_append(&local_e0,character);
          }
        }
        else if (iVar6 == 0xff5f) {
          if (iVar17 != 2) {
            TokensBuilder::segment(&local_e0);
            if ((iVar17 == 1) || (iVar17 == 0 && local_124 != -2)) {
              local_e0._current_token.join_left = true;
            }
            else {
              ((local_e0._tokens)->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
              _M_impl.super__Vector_impl_data._M_finish[-1].join_right = true;
            }
          }
          std::__cxx11::string::append((char *)&local_e0._current_token,(ulong)character->data);
LAB_001b4928:
          local_e0._current_length = local_e0._current_length + 1;
          iVar17 = 4;
        }
        else {
          CVar1 = character->char_type;
          if (CVar1 == Separator) {
            if (end == begin) {
              if (iVar17 != 2) {
                TokensBuilder::segment(&local_e0);
              }
              iVar17 = 2;
              if ((this->_options).with_separators == true) {
                std::__cxx11::string::append
                          ((char *)&local_e0._current_token,(ulong)character->data);
                local_e0._current_length = local_e0._current_length + 1;
                if ((pCVar18 == (pointer)0x0) || (pCVar18->char_type != Separator)) {
                  TokensBuilder::segment(&local_e0);
                }
              }
              goto LAB_001b4936;
            }
            if (iVar17 != 2) {
              TokensBuilder::segment(&local_e0);
              local_e0._current_token.join_left = true;
            }
            TokensBuilder::escape_append(&local_e0,character);
            TokensBuilder::append(&local_e0,&local_118,begin,end);
            TokensBuilder::segment(&local_e0);
            iVar17 = 3;
LAB_001b4908:
            uVar12 = end - 1;
          }
          else {
            if ((this->_options).support_prior_joiners == true) {
              iVar6 = std::__cxx11::string::compare
                                ((ulong)local_58,0,(char *)(this->_options).joiner._M_string_length,
                                 (ulong)character->data);
              if (iVar6 == 0) {
                if (iVar17 == 2) {
                  local_e0._current_token.join_left = true;
                }
                else {
                  if (iVar17 == 3) {
                    ((local_e0._tokens)->
                    super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                    super__Vector_impl_data._M_finish[-1].join_right = true;
                    iVar17 = 3;
                    goto LAB_001b4936;
                  }
                  TokensBuilder::segment(&local_e0);
                  ((local_e0._tokens)->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>
                  )._M_impl.super__Vector_impl_data._M_finish[-1].join_right = true;
                }
                iVar17 = 2;
                goto LAB_001b4936;
              }
              CVar1 = character->char_type;
            }
            local_128 = -1;
            local_120 = CVar1;
            if (CVar1 == Number) {
              local_128 = -3;
              __s = "Numeric";
              if (local_100 ==
                  (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)0x0) {
                MVar8 = (this->_options).mode;
                if (MVar8 != Conservative) {
LAB_001b4a56:
                  if (MVar8 == Char || local_120 != Number) {
                    if (iVar17 != 2) {
                      TokensBuilder::segment(&local_e0);
                      local_e0._current_token.join_left = true;
                      if (((this->_options).preserve_segmented_tokens == true) &&
                         (character->char_type == Mark)) {
                        local_e0._current_token.preserve = true;
                      }
                    }
                    TokensBuilder::safe_append(&local_e0,character);
                    if (end != begin) {
                      TokensBuilder::append(&local_e0,&local_118,begin,end);
                      uVar12 = end - 1;
                    }
                    iVar17 = 3;
                    TokensBuilder::segment(&local_e0);
                    goto LAB_001b4936;
                  }
                  bVar4 = iVar17 == 1 & (this->_options).segment_numbers;
                  if (iVar17 == 0 || bVar4 != 0) {
                    if ((bVar4 & (this->_options).preserve_segmented_tokens) == 1) {
                      local_e0._current_token.preserve = true;
                    }
                    TokensBuilder::segment(&local_e0);
                    if ((iVar17 == 0) && (local_124 != -2)) {
                      local_e0._current_token.join_left = true;
                    }
                    else {
LAB_001b4b2c:
                      ((local_e0._tokens)->
                      super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                      super__Vector_impl_data._M_finish[-1].join_right = true;
                    }
                  }
                  else if (iVar17 == 3) goto LAB_001b4b2c;
                  TokensBuilder::safe_append(&local_e0,character);
                  iVar17 = 1;
                  if (end == begin) goto LAB_001b4936;
                  TokensBuilder::append(&local_e0,&local_118,begin,end);
                  goto LAB_001b4908;
                }
              }
              else {
LAB_001b4973:
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_50,__s,&local_119);
                pmVar10 = std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[](local_100,&local_50);
                *pmVar10 = *pmVar10 + 1;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                MVar8 = (this->_options).mode;
                if (MVar8 != Conservative) goto LAB_001b4a2e;
                if (local_120 != Number) goto LAB_001b4a15;
              }
LAB_001b4bd2:
              local_128 = -3;
            }
            else {
              if (CVar1 == Letter) {
                local_128 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar12];
              }
              if (local_100 !=
                  (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)0x0) {
                __s = "Other";
                if ((CVar1 == Letter) && (__s = "Other", -1 < local_128)) {
                  __s = unicode::get_script_name(local_128);
                }
                goto LAB_001b4973;
              }
              MVar8 = (this->_options).mode;
              if (MVar8 == Conservative) {
LAB_001b4a15:
                iVar6 = character->value;
                if (iVar6 == 0x5f) goto LAB_001b4bd2;
                MVar7 = Conservative;
                MVar8 = Conservative;
                if (iVar17 == 0) {
                  if (iVar6 == 0x2d) goto LAB_001b4bd2;
                  MVar8 = MVar7;
                  if (iVar6 == 0x2e) {
                    if (pCVar18 != (pointer)0x0) {
LAB_001b4bc4:
                      if ((pCVar18->char_type & ~Number) == Letter) goto LAB_001b4bd2;
                    }
                  }
                  else if ((pCVar18 != (pointer)0x0) && (iVar6 == 0x2c)) goto LAB_001b4bc4;
                }
              }
LAB_001b4a2e:
              if (MVar8 == Char || local_120 != Letter) goto LAB_001b4a56;
            }
            CVar9 = update_casing(local_e0._current_token.casing,character->case_type,
                                  local_e0._current_length);
            iVar6 = local_124;
            if (iVar17 == 1) {
              bVar3 = false;
LAB_001b4c42:
              bVar2 = false;
              cVar5 = '\0';
LAB_001b4c44:
              local_e0._current_token.join_right = true;
              if (((this->_options).preserve_segmented_tokens == true) &&
                 ((bVar2 || bVar3 || (cVar5 != '\0')))) {
                local_e0._current_token.preserve = true;
              }
              TokensBuilder::segment(&local_e0);
              CVar9 = update_casing(local_e0._current_token.casing,character->case_type,0);
              local_e0._current_token.casing = CVar9;
            }
            else {
              if (iVar17 == 0) {
                if ((-1 < local_128 && local_124 == local_128) &&
                   (cVar11 = std::
                             _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::find(local_60,&local_128),
                   cVar11.super__Node_iterator_base<int,_false>._M_cur != (__node_type *)0x0)) {
                  bVar3 = true;
                  goto LAB_001b4c42;
                }
                if (iVar6 == local_128) {
                  cVar5 = '\0';
                }
                else {
                  cVar5 = (this->_options).segment_alphabet_change;
                  bVar2 = false;
                  if ((bool)cVar5 != false) {
                    bVar3 = false;
                    goto LAB_001b4c44;
                  }
                }
                bVar2 = false;
                bVar3 = false;
                if (iVar6 != -2) {
                  if ((CVar9 != Mixed) || ((this->_options).segment_case == false)) {
                    local_e0._current_token.casing = CVar9;
                    goto LAB_001b4d03;
                  }
                  bVar3 = false;
                  bVar2 = true;
                }
                goto LAB_001b4c44;
              }
              local_e0._current_token.casing = CVar9;
              if ((iVar17 == 3) && (local_e0._current_token.surface._M_string_length == 0)) {
                ((local_e0._tokens)->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
                _M_impl.super__Vector_impl_data._M_finish[-1].join_right = true;
              }
            }
LAB_001b4d03:
            TokensBuilder::safe_append(&local_e0,character);
            if (end != begin) {
              TokensBuilder::append(&local_e0,&local_118,begin,end);
              uVar12 = end - 1;
            }
            iVar17 = 0;
            local_124 = local_128;
          }
        }
      }
LAB_001b4936:
      uVar12 = uVar12 + 1;
      uVar16 = (long)local_118.
                     super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_118.
                     super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
    } while (uVar12 < uVar16);
  }
  TokensBuilder::~TokensBuilder(&local_e0);
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_118.
      super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Tokenizer::tokenize_text(const std::string& text,
                                std::vector<Token>& annotated_tokens,
                                std::unordered_map<std::string, size_t>* alphabets) const
  {
    // TODO: this method has grown big and is hard to follow. It should be refactored into
    // smaller pieces to clarify its logic.

    const auto chars = unicode::get_characters_info(text);

    std::vector<int> scripts;

    {
      scripts.reserve(chars.size());
      int previous_script = -1;
      for (const auto& c : chars) {
        const int script = unicode::get_script(c.value, previous_script);
        scripts.emplace_back(script);
        if (script != -1)
          previous_script = script;
      }
    }

    TokensBuilder builder(_options, annotated_tokens);
    State state = State::Space;
    int prev_alphabet = -1;

    for (size_t i = 0; i < chars.size(); ++i)
    {
      const auto& c = chars[i];
      const unicode::code_point_t v = c.value;
      if (v < 32 || v == 0xFEFF)  // skip special characters and BOM
        continue;

      const size_t next_index = get_next_main_char(chars, scripts, i, _options);
      const auto* next_c = next_index < chars.size() ? &chars[next_index] : nullptr;
      const bool has_combining_marks = (next_index != i + 1);

      if (state == State::Placeholder)
      {
        if (v == ph_marker_close_cp)
        {
          builder.append(c);
          if (_options.preserve_placeholders)
            builder.current().preserve = true;
          prev_alphabet = placeholder_alphabet;
          state = State::Letter;
        }
        else if (c.char_type == unicode::CharType::Separator)
          builder.escape_append(c);
        else
          builder.append(c);
      }

      else if (v == ph_marker_open_cp)
      {
        if (state != State::Space)
        {
          builder.segment();
          if ((state == State::Letter && prev_alphabet != placeholder_alphabet)
              || state == State::Number)
            builder.current().join_left = true;
          else
            builder.previous().join_right = true;
        }
        builder.append(c);
        state = State::Placeholder;
      }

      else if (c.char_type == unicode::CharType::Separator)
      {
        if (has_combining_marks)
        {
          if (state != State::Space)
          {
            builder.segment();
            builder.current().join_left = true;
          }

          builder.escape_append(c);
          builder.append(chars, i + 1, next_index);
          builder.segment();
          i = next_index - 1;
          state = State::Other;
        }
        else
        {
          if (state != State::Space)
            builder.segment();

          if (_options.with_separators)
          {
            builder.append(c);
            if (!next_c || next_c->char_type != unicode::CharType::Separator)
              builder.segment();
          }

          state = State::Space;
        }
      }

      else if (_options.support_prior_joiners && c == _options.joiner)
      {
        if (state == State::Other)
          builder.previous().join_right = true;
        else if (state == State::Space)
          builder.current().join_left = true;
        else
        {
          builder.segment();
          builder.previous().join_right = true;
          state = State::Space;
        }
      }

      else
      {
        bool is_letter = c.char_type == unicode::CharType::Letter;
        bool is_number = c.char_type == unicode::CharType::Number;

        int alphabet = -1;
        if (is_number)
          alphabet = number_alphabet;
        else if (is_letter)
          alphabet = scripts[i];

        if (alphabets != nullptr)
        {
          const char* alphabet_name = "Other";
          if (is_number)
            alphabet_name = "Numeric";
          else if (is_letter && alphabet >= 0)
            alphabet_name = unicode::get_script_name(alphabet);
          (*alphabets)[alphabet_name]++;
        }

        if (_options.mode == Mode::Conservative)
        {
          if (is_number
              || (c == '_')
              || (state == State::Letter && c == '-')
              || (state == State::Letter
                  && (c == '.' || c == ',')
                  && next_c
                  && (next_c->char_type == unicode::CharType::Number
                      || next_c->char_type == unicode::CharType::Letter)))
          {
            is_letter = true;
            alphabet = number_alphabet;
          }
        }

        if (is_letter && _options.mode != Mode::Char)
        {
          const Casing new_casing = update_casing(builder.current().casing,
                                                  c.case_type,
                                                  builder.current_length());

          bool segment_case = false;
          bool segment_alphabet = false;
          bool segment_alphabet_change = false;
          if (state == State::Number
              || (state == State::Letter &&
                  ((segment_alphabet = (prev_alphabet == alphabet
                                        && alphabet >= 0
                                        && (_options.segment_alphabet_codes.find(alphabet)
                                            != _options.segment_alphabet_codes.end())))
                   || (segment_alphabet_change = (prev_alphabet != alphabet
                                                  && _options.segment_alphabet_change))
                   || (prev_alphabet == placeholder_alphabet)
                   || (_options.segment_case
                       && (segment_case = (new_casing == Casing::Mixed))))))
          {
            builder.current().join_right = true;
            if (_options.preserve_segmented_tokens
                && (segment_case || segment_alphabet || segment_alphabet_change))
              builder.current().preserve = true;
            builder.segment();
            builder.current().casing = update_casing(builder.current().casing, c.case_type, 0);
          }
          else
          {
            builder.current().casing = new_casing;
            if (state == State::Other && builder.is_new_token())
              builder.previous().join_right = true;
          }

          builder.safe_append(c);
          if (has_combining_marks)
          {
            builder.append(chars, i + 1, next_index);
            i = next_index - 1;
          }
          state = State::Letter;
          prev_alphabet = alphabet;
        }
        else if (is_number && _options.mode != Mode::Char)
        {
          const bool segment_number = (_options.segment_numbers && state == State::Number);
          if (state == State::Letter || segment_number)
          {
            if (_options.preserve_segmented_tokens && segment_number)
              builder.current().preserve = true;
            builder.segment();
            if (state != State::Letter || prev_alphabet == placeholder_alphabet)
              builder.previous().join_right = true;
            else
              builder.current().join_left = true;
          }
          else if (state == State::Other)
          {
            builder.previous().join_right = true;
          }

          builder.safe_append(c);
          if (has_combining_marks)
          {
            builder.append(chars, i + 1, next_index);
            i = next_index - 1;
          }
          state = State::Number;
        }
        else
        {
          if (state != State::Space)
          {
            builder.segment();
            builder.current().join_left = true;
            if (_options.preserve_segmented_tokens && c.char_type == unicode::CharType::Mark)
              builder.current().preserve = true;
          }

          builder.safe_append(c);
          if (has_combining_marks)
          {
            builder.append(chars, i + 1, next_index);
            i = next_index - 1;
          }
          builder.segment();
          state = State::Other;
        }
      }
    }
  }